

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

void __thiscall re2c::SwitchIf::SwitchIf(SwitchIf *this,Span *sp,uint32_t nsp,State *next)

{
  opt_t *poVar1;
  Cases *this_00;
  If *pIVar2;
  State *next_local;
  uint32_t nsp_local;
  Span *sp_local;
  SwitchIf *this_local;
  
  this->type = IF;
  memset(&this->info,0,8);
  poVar1 = Opt::operator->((Opt *)&opts);
  if ((((poVar1->sFlag & 1U) == 0) && (2 < nsp)) ||
     ((8 < nsp && (sp[nsp - 2].ub - sp->ub <= (nsp - 2) * 3)))) {
    this->type = SWITCH;
    this_00 = (Cases *)operator_new(0x18);
    Cases::Cases(this_00,sp,nsp);
    (this->info).cases = this_00;
  }
  else if (nsp < 6) {
    pIVar2 = (If *)operator_new(0x10);
    If::If(pIVar2,LINEAR,sp,nsp,next);
    (this->info).ifs = pIVar2;
  }
  else {
    pIVar2 = (If *)operator_new(0x10);
    If::If(pIVar2,BINARY,sp,nsp,next);
    (this->info).ifs = pIVar2;
  }
  return;
}

Assistant:

SwitchIf::SwitchIf (const Span * sp, uint32_t nsp, const State * next)
	: type (IF)
	, info ()
{
	if ((!opts->sFlag && nsp > 2) || (nsp > 8 && (sp[nsp - 2].ub - sp[0].ub <= 3 * (nsp - 2))))
	{
		type = SWITCH;
		info.cases = new Cases (sp, nsp);
	}
	else if (nsp > 5)
	{
		info.ifs = new If (If::BINARY, sp, nsp, next);
	}
	else
	{
		info.ifs = new If (If::LINEAR, sp, nsp, next);
	}
}